

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::_::UnverifiedConfig> *
kj::_::populateUnverifiedConfig
          (Maybe<kj::_::UnverifiedConfig> *__return_storage_ptr__,Array<kj::_::KeyMaybeVal> *params)

{
  bool bVar1;
  size_t sVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::_::ParamType>_2 aVar3;
  NullableValue<kj::_::ParamType> *other;
  ParamType *pPVar4;
  UnverifiedConfig *t;
  UnverifiedConfig *local_160;
  Array<kj::_::KeyMaybeVal> **local_150;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> *local_f0;
  ArrayPtr<const_char> *value;
  ArrayPtr<const_char> *_value4956;
  UnverifiedConfig *local_d8;
  Maybe<kj::ArrayPtr<const_char>_> *maxBitsSetting;
  int local_c8;
  Array<kj::_::KeyMaybeVal> **local_c0;
  bool *takeOverSetting;
  anon_enum_32 *property;
  anon_enum_32 *side;
  ParamType *paramType;
  undefined1 local_94 [8];
  NullableValue<kj::_::ParamType> _paramType4927;
  KeyMaybeVal *param;
  KeyMaybeVal *__end2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::_::ParamType>_2 local_68;
  KeyMaybeVal *__begin2;
  Array<kj::_::KeyMaybeVal> *__range2;
  UnverifiedConfig config;
  Array<kj::_::KeyMaybeVal> *params_local;
  
  sVar2 = Array<kj::_::KeyMaybeVal>::size(params);
  if (sVar2 < 5) {
    UnverifiedConfig::UnverifiedConfig((UnverifiedConfig *)&__range2);
    local_68 = (anon_union_8_1_a8c68091_for_NullableValue<kj::_::ParamType>_2)
               Array<kj::_::KeyMaybeVal>::begin(params);
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<kj::_::ParamType>_2)
            Array<kj::_::KeyMaybeVal>::end(params);
    for (; local_68 != aVar3; local_68.value = local_68.value + 0x28) {
      _paramType4927.field_1 = local_68;
      parseKeyName((_ *)&paramType,(ArrayPtr<const_char> *)local_68);
      other = readMaybe<kj::_::ParamType>((Maybe<kj::_::ParamType> *)&paramType);
      NullableValue<kj::_::ParamType>::NullableValue
                ((NullableValue<kj::_::ParamType> *)local_94,other);
      Maybe<kj::_::ParamType>::~Maybe((Maybe<kj::_::ParamType> *)&paramType);
      pPVar4 = NullableValue::operator_cast_to_ParamType_((NullableValue *)local_94);
      if (pPVar4 == (ParamType *)0x0) {
        Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__);
        local_c8 = 1;
      }
      else {
        property = &NullableValue<kj::_::ParamType>::operator*
                              ((NullableValue<kj::_::ParamType> *)local_94)->side;
        takeOverSetting = (bool *)&((ParamType *)property)->property;
        side = property;
        if (*(anon_enum_32 *)takeOverSetting == CLIENT) {
          if (((ParamType *)property)->side == CLIENT) {
            local_150 = &__range2;
          }
          else {
            local_150 = (Array<kj::_::KeyMaybeVal> **)((long)&__range2 + 1);
          }
          local_c0 = local_150;
          if (((ulong)*local_150 & 1) == 1) {
            Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__);
            local_c8 = 1;
          }
          else {
            bVar1 = Maybe<kj::ArrayPtr<const_char>_>::operator==
                              ((Maybe<kj::ArrayPtr<const_char>_> *)
                               ((long)_paramType4927.field_1 + 0x10));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              *(byte *)local_c0 = 1;
              goto LAB_0061efb8;
            }
            Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__);
            local_c8 = 1;
          }
        }
        else {
          if (*(anon_enum_32 *)takeOverSetting == MAX_WINDOW_BITS) {
            if (((ParamType *)property)->side == CLIENT) {
              local_160 = &config;
            }
            else {
              local_160 = (UnverifiedConfig *)((long)&config.clientMaxWindowBits.ptr.field_1 + 8);
            }
            local_d8 = local_160;
            bVar1 = Maybe<kj::ArrayPtr<const_char>_>::operator==
                              ((Maybe<kj::ArrayPtr<const_char>_> *)local_160);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__);
              local_c8 = 1;
              goto LAB_0061efde;
            }
            value = readMaybe<kj::ArrayPtr<char_const>>
                              ((Maybe<kj::ArrayPtr<const_char>_> *)
                               ((long)_paramType4927.field_1 + 0x10));
            if (value == (ArrayPtr<const_char> *)0x0) {
              ArrayPtr<const_char>::ArrayPtr(&local_108);
              Maybe<kj::ArrayPtr<const_char>_>::operator=
                        ((Maybe<kj::ArrayPtr<const_char>_> *)local_d8,&local_108);
            }
            else {
              local_f0 = value;
              sVar2 = ArrayPtr<const_char>::size(value);
              if (sVar2 == 0) {
                Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__);
                local_c8 = 1;
                goto LAB_0061efde;
              }
              Maybe<kj::ArrayPtr<const_char>_>::operator=
                        ((Maybe<kj::ArrayPtr<const_char>_> *)local_d8,
                         (Maybe<kj::ArrayPtr<const_char>_> *)((long)_paramType4927.field_1 + 0x10));
            }
          }
LAB_0061efb8:
          local_c8 = 0;
        }
      }
LAB_0061efde:
      NullableValue<kj::_::ParamType>::~NullableValue((NullableValue<kj::_::ParamType> *)local_94);
      if (local_c8 != 0) goto LAB_0061f02d;
    }
    t = mv<kj::_::UnverifiedConfig>((UnverifiedConfig *)&__range2);
    Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__,t);
    local_c8 = 1;
LAB_0061f02d:
    UnverifiedConfig::~UnverifiedConfig((UnverifiedConfig *)&__range2);
  }
  else {
    Maybe<kj::_::UnverifiedConfig>::Maybe(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<UnverifiedConfig> populateUnverifiedConfig(kj::Array<KeyMaybeVal>& params) {
  // Given a collection of <key, MaybeValue> pairs, attempt to populate an `UnverifiedConfig` struct.
  // If the struct cannot be populated, we return null.
  //
  // This function populates the struct with what it finds, it does not perform bounds checking or
  // concern itself with valid `Value`s (so long as the `Value` is non-empty).
  //
  // The following issues would prevent a struct from being populated:
  //  Key issues:
  //    - `Key` is invalid (see `parseKeyName()`).
  //    - `Key` is repeated.
  //  Value issues:
  //    - Got a `Value` when none was expected (only the `max_window_bits` parameters expect values).
  //    - Got an empty `Value` (0 characters, or all whitespace characters).

  if (params.size() > 4) {
    // We expect 4 `Key`s at most, having more implies repeats/invalid keys are present.
    return kj::none;
  }

  UnverifiedConfig config;

  for (auto& param : params) {
    KJ_IF_SOME(paramType, parseKeyName(param.key)) {
      // `Key` is valid, but we still want to check for repeats.
      const auto& side = paramType.side;
      const auto& property = paramType.property;

      if (property == ParamType::NO_CONTEXT_TAKEOVER) {
        auto& takeOverSetting = (side == ParamType::CLIENT) ?
            config.clientNoContextTakeover : config.serverNoContextTakeover;

        if (takeOverSetting == true) {
          // This `Key` is a repeat; invalid config.
          return kj::none;
        }

        if (param.val != kj::none) {
          // The `x_no_context_takeover` parameter shouldn't have a value; invalid config.
          return kj::none;
        }

        takeOverSetting = true;
      } else if (property == ParamType::MAX_WINDOW_BITS) {
        auto& maxBitsSetting =
            (side == ParamType::CLIENT) ? config.clientMaxWindowBits : config.serverMaxWindowBits;

        if (maxBitsSetting != kj::none) {
          // This `Key` is a repeat; invalid config.
          return kj::none;
        }

        KJ_IF_SOME(value, param.val) {
          if (value.size() == 0) {
            // This is equivalent to `x_max_window_bits=`, since we got an "=" we expected a token
            // to follow.
            return kj::none;
          }
          maxBitsSetting = param.val;
        } else {
          // We know we got this `max_window_bits` parameter in a Request/Response, and we also know
          // that it didn't include an "=" (otherwise the value wouldn't be null).
          // It's important to retain the information that the parameter was received *without* a
          // corresponding value, as this may determine whether the offer is valid or not.
          //
          // To retain this information, we'll set `maxBitsSetting` to be an empty ArrayPtr so this
          // can be dealt with properly later.
          maxBitsSetting = ArrayPtr<const char>();
        }
      }
    } else {
      // Invalid parameter.
      return kj::none;
    }
  }